

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModulationType.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::ModulationType::Encode(ModulationType *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_short>(stream,(this->field_0).m_ui16SpreadSpectrum);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16MajorModulationType);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Detail);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16System);
  return;
}

Assistant:

void ModulationType::Encode( KDataStream & stream ) const
{
    stream << m_ui16SpreadSpectrum
           << m_ui16MajorModulationType
           << m_ui16Detail
           << m_ui16System;
}